

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktau.hpp
# Opt level: O1

double wdm::impl::ktau(vector<double,_std::allocator<double>_> *x,
                      vector<double,_std::allocator<double>_> *y,
                      vector<double,_std::allocator<double>_> *weights)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double num_d;
  allocator_type local_61;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  value_type_conflict local_40;
  vector<double,_std::allocator<double>_> local_38;
  
  utils::check_sizes(x,y,weights);
  utils::sort_all(x,y,weights);
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
  if (uVar7 < 2) {
    uVar9 = 1;
    local_58 = 0.0;
    dVar14 = 0.0;
    dVar10 = 0.0;
  }
  else {
    dVar10 = 0.0;
    uVar8 = 1;
    uVar9 = 1;
    dVar14 = 0.0;
    local_58 = 0.0;
    do {
      if ((pdVar4[uVar8] != pdVar4[uVar8 - 1]) || (NAN(pdVar4[uVar8]) || NAN(pdVar4[uVar8 - 1]))) {
        if (1 < uVar9) {
          if (pdVar3 == pdVar2) {
            lVar6 = (uVar9 - 1) * uVar9;
            auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar16._0_8_ = lVar6;
            auVar16._12_4_ = 0x45300000;
            dVar15 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
          }
          else {
            dVar15 = dVar14 * dVar14 - dVar10;
          }
          local_58 = local_58 + dVar15 * 0.5;
          uVar9 = 1;
        }
      }
      else {
        if (pdVar3 != pdVar2) {
          if (uVar9 == 1) {
            dVar14 = pdVar2[uVar8 - 1];
            dVar10 = dVar14 * dVar14;
          }
          dVar15 = pdVar2[uVar8];
          dVar14 = dVar14 + dVar15;
          dVar10 = dVar10 + dVar15 * dVar15;
        }
        uVar9 = uVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (1 < uVar9) {
    if (pdVar3 == pdVar2) {
      lVar6 = (uVar9 - 1) * uVar9;
      auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar11._0_8_ = lVar6;
      auVar11._12_4_ = 0x45300000;
      dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      dVar10 = dVar14 * dVar14 - dVar10;
    }
    local_58 = local_58 + dVar10 * 0.5;
  }
  if (uVar7 < 2) {
    uVar9 = 1;
    local_60 = 0.0;
    dVar14 = 0.0;
    dVar10 = 0.0;
  }
  else {
    pdVar5 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = 0.0;
    uVar8 = 1;
    uVar9 = 1;
    dVar14 = 0.0;
    local_60 = 0.0;
    do {
      if ((((pdVar4[uVar8] != pdVar4[uVar8 - 1]) || (NAN(pdVar4[uVar8]) || NAN(pdVar4[uVar8 - 1])))
          || (dVar15 = pdVar5[uVar8], pdVar1 = pdVar5 + (uVar8 - 1), dVar15 != *pdVar1)) ||
         (NAN(dVar15) || NAN(*pdVar1))) {
        if (1 < uVar9) {
          if (pdVar3 == pdVar2) {
            lVar6 = (uVar9 - 1) * uVar9;
            auVar17._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar17._0_8_ = lVar6;
            auVar17._12_4_ = 0x45300000;
            dVar15 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
          }
          else {
            dVar15 = dVar14 * dVar14 - dVar10;
          }
          local_60 = local_60 + dVar15 * 0.5;
          uVar9 = 1;
        }
      }
      else {
        if (pdVar3 != pdVar2) {
          if (uVar9 == 1) {
            dVar14 = pdVar2[uVar8 - 1];
            dVar10 = dVar14 * dVar14;
          }
          dVar15 = pdVar2[uVar8];
          dVar14 = dVar14 + dVar15;
          dVar10 = dVar10 + dVar15 * dVar15;
        }
        uVar9 = uVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (1 < uVar9) {
    if (pdVar3 == pdVar2) {
      lVar6 = (uVar9 - 1) * uVar9;
      auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar12._0_8_ = lVar6;
      auVar12._12_4_ = 0x45300000;
      dVar10 = (auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      dVar10 = dVar14 * dVar14 - dVar10;
    }
    local_60 = local_60 + dVar10 * 0.5;
  }
  local_48 = 0.0;
  utils::merge_sort(y,weights,&local_48);
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = (long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
  if (uVar7 < 2) {
    uVar9 = 1;
    local_50 = 0.0;
    dVar14 = 0.0;
    dVar10 = 0.0;
  }
  else {
    dVar10 = 0.0;
    uVar8 = 1;
    uVar9 = 1;
    dVar14 = 0.0;
    local_50 = 0.0;
    do {
      if ((pdVar4[uVar8] != pdVar4[uVar8 - 1]) || (NAN(pdVar4[uVar8]) || NAN(pdVar4[uVar8 - 1]))) {
        if (1 < uVar9) {
          if (pdVar3 == pdVar2) {
            lVar6 = (uVar9 - 1) * uVar9;
            auVar18._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar18._0_8_ = lVar6;
            auVar18._12_4_ = 0x45300000;
            dVar15 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
          }
          else {
            dVar15 = dVar14 * dVar14 - dVar10;
          }
          local_50 = local_50 + dVar15 * 0.5;
          uVar9 = 1;
        }
      }
      else {
        if (pdVar3 != pdVar2) {
          if (uVar9 == 1) {
            dVar14 = pdVar2[uVar8 - 1];
            dVar10 = dVar14 * dVar14;
          }
          dVar15 = pdVar2[uVar8];
          dVar14 = dVar14 + dVar15;
          dVar10 = dVar10 + dVar15 * dVar15;
        }
        uVar9 = uVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  if (1 < uVar9) {
    if (pdVar3 == pdVar2) {
      lVar6 = (uVar9 - 1) * uVar9;
      auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar13._0_8_ = lVar6;
      auVar13._12_4_ = 0x45300000;
      dVar10 = (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      dVar10 = dVar14 * dVar14 - dVar10;
    }
    local_50 = local_50 + dVar10 * 0.5;
  }
  if (pdVar3 == pdVar2) {
    local_40 = 1.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_38,
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_40,&local_61);
    pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar2 != (pointer)0x0) {
      operator_delete(pdVar2);
    }
    if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  dVar14 = utils::perm_sum(weights,2);
  dVar10 = dVar14 - local_58;
  local_58 = (dVar14 - ((local_58 + local_48 + local_50) - local_60)) - local_48;
  dVar10 = (dVar14 - local_50) * dVar10;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  return local_58 / dVar10;
}

Assistant:

inline double ktau(std::vector<double> x,
                   std::vector<double> y,
                   std::vector<double> weights = std::vector<double>())
{
    utils::check_sizes(x, y, weights);

    // 1.1 Sort x, y, and weights in x order; break ties in according to y.
    utils::sort_all(x, y, weights);

    // 1.2 Count pairs of tied x and simultaneous ties in x and y.
    double ties_x = utils::count_tied_pairs(x, weights);
    double ties_both = utils::count_joint_ties(x, y, weights);

    // 2.1 Sort y again and count exchanges (= number of discordant pairs).
    double num_d = 0.0;
    utils::merge_sort(y, weights, num_d);

    // 2.2 Count pairs of tied y.
    double ties_y = utils::count_tied_pairs(y, weights);

    // 3. Calculate Kendall's tau.
    if (weights.size() == 0)
        weights = std::vector<double>(x.size(), 1.0);
    double num_pairs = utils::perm_sum(weights, 2);
    double num_c = num_pairs - (num_d + ties_x + ties_y - ties_both);
    double tau = num_c - num_d;
    tau /= std::sqrt((num_pairs - ties_x) * (num_pairs - ties_y));

    return tau;
}